

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O1

CLabel * __thiscall
IRT::CLabelStatement::Label(CLabel *__return_storage_ptr__,CLabelStatement *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->label)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->label).field_2;
  pcVar1 = (this->label).label._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->label).label._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

CLabel CLabelStatement::Label( ) const {
    return label;
}